

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getV2f(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
           _func_void_char_ptr_V2f_ptr *check)

{
  double dVar1;
  Vec2 *pVVar2;
  invalid_argument *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  allocator<char> local_a1;
  V2f local_a0;
  undefined1 local_98 [16];
  string local_80 [32];
  SetAttr local_60;
  
  if (*i <= argc + -3) {
    dVar1 = strtod(argv[(long)*i + 1],(char **)0x0);
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._0_8_ = dVar1;
    local_98._12_4_ = extraout_XMM0_Dd;
    dVar1 = strtod(argv[(long)*i + 2],(char **)0x0);
    local_a0.y = (float)dVar1;
    local_a0.x = (float)(double)local_98._0_8_;
    if (check != (_func_void_char_ptr_V2f_ptr *)0x0) {
      (*check)(attrName,&local_a0);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_80,attrName,&local_a1);
    pVVar2 = (Vec2 *)operator_new(0x10);
    Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute(pVVar2);
    std::__cxx11::string::string((string *)&local_60,local_80);
    local_60.part = part;
    local_60.attr = (Attribute *)pVVar2;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string(local_80);
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected two floats");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getV2f (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const V2f& v) = 0)
{
    if (i > argc - 3)
        throw invalid_argument ("Expected two floats");

    V2f v (
        static_cast<float> (strtod (argv[i + 1], 0)),
        static_cast<float> (strtod (argv[i + 2], 0)));

    if (check) check (attrName, v);

    attrs.push_back (SetAttr (attrName, part, new V2fAttribute (v)));
    i += 3;
}